

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O2

SW_FT_Long SW_FT_MulDiv(SW_FT_Long a,SW_FT_Long b,SW_FT_Long c)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  if (c == 0) {
    uVar2 = 0x7fffffff;
  }
  else {
    uVar2 = -c;
    if (0 < c) {
      uVar2 = c;
    }
    lVar1 = b * a;
    lVar5 = -lVar1;
    if (0 < lVar1) {
      lVar5 = lVar1;
    }
    uVar2 = ((uVar2 >> 1) + lVar5) / uVar2;
  }
  uVar6 = (uint)(a >> 0x3f) | 1;
  uVar4 = -uVar6;
  if (-1 < b) {
    uVar4 = uVar6;
  }
  uVar6 = -uVar4;
  if (-1 < c) {
    uVar6 = uVar4;
  }
  uVar3 = -uVar2;
  if (0 < (int)uVar6) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

SW_FT_Long SW_FT_MulDiv(SW_FT_Long a, SW_FT_Long b, SW_FT_Long c)
{
    SW_FT_Int  s = 1;
    SW_FT_Long d;

    SW_FT_MOVE_SIGN(a, s);
    SW_FT_MOVE_SIGN(b, s);
    SW_FT_MOVE_SIGN(c, s);

    d = (SW_FT_Long)(c > 0 ? ((SW_FT_Int64)a * b + (c >> 1)) / c : 0x7FFFFFFFL);

    return (s > 0) ? d : -d;
}